

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayFill
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,ArrayFill *curr)

{
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *pEVar2;
  Literal *pLVar3;
  element_type *peVar4;
  size_t sVar5;
  ulong local_1f0;
  size_t i;
  size_t arraySize;
  Literal local_1c8;
  uintptr_t local_1b0;
  HeapType local_1a8;
  uintptr_t uStack_1a0;
  undefined1 auStack_198 [8];
  Field field;
  size_t sizeVal;
  Literal fillVal;
  size_t indexVal;
  shared_ptr<wasm::GCData> data;
  Flow size;
  Flow value;
  Flow index;
  undefined1 local_68 [8];
  Flow ref;
  ArrayFill *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  ref.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  visit((Flow *)local_68,pEVar2,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x10));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    visit((Flow *)&value.breakTo.super_IString.str._M_str,pEVar2,
          *(Expression **)(ref.breakTo.super_IString.str._M_str + 0x18));
    bVar1 = Flow::breaking((Flow *)&value.breakTo.super_IString.str._M_str);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&value.breakTo.super_IString.str._M_str);
    }
    else {
      pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      visit((Flow *)&size.breakTo.super_IString.str._M_str,pEVar2,
            *(Expression **)(ref.breakTo.super_IString.str._M_str + 0x20));
      bVar1 = Flow::breaking((Flow *)&size.breakTo.super_IString.str._M_str);
      if (bVar1) {
        Flow::Flow(__return_storage_ptr__,(Flow *)&size.breakTo.super_IString.str._M_str);
      }
      else {
        pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
        visit((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ,pEVar2,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x28));
        bVar1 = Flow::breaking((Flow *)&data.
                                        super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
        if (bVar1) {
          Flow::Flow(__return_storage_ptr__,
                     (Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
        }
        else {
          Flow::getSingleValue((Flow *)local_68);
          wasm::Literal::getGCData((Literal *)&indexVal);
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&indexVal);
          if (!bVar1) {
            (*this->_vptr_ExpressionRunner[2])(this,"null ref");
          }
          pLVar3 = Flow::getSingleValue((Flow *)&value.breakTo.super_IString.str._M_str);
          fillVal.type.id = wasm::Literal::getUnsigned(pLVar3);
          pLVar3 = Flow::getSingleValue((Flow *)&size.breakTo.super_IString.str._M_str);
          wasm::Literal::Literal((Literal *)&sizeVal,pLVar3);
          pLVar3 = Flow::getSingleValue
                             ((Flow *)&data.
                                       super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount);
          field._8_8_ = wasm::Literal::getUnsigned(pLVar3);
          local_1b0 = (uintptr_t)
                      wasm::Type::getHeapType
                                ((Type *)(*(long *)(ref.breakTo.super_IString.str._M_str + 0x10) + 8
                                         ));
          HeapType::getArray(&local_1a8);
          auStack_198 = (undefined1  [8])local_1a8.id;
          field.type.id = uStack_1a0;
          wasm::Literal::Literal((Literal *)&arraySize,(Literal *)&sizeVal);
          truncateForPacking(&local_1c8,this,(Literal *)&arraySize,(Field *)auStack_198);
          wasm::Literal::operator=((Literal *)&sizeVal,&local_1c8);
          wasm::Literal::~Literal(&local_1c8);
          wasm::Literal::~Literal((Literal *)&arraySize);
          peVar4 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&indexVal);
          sVar5 = SmallVector<wasm::Literal,_1UL>::size
                            (&(peVar4->values).super_SmallVector<wasm::Literal,_1UL>);
          if ((((sVar5 < fillVal.type.id) || (sVar5 < (ulong)field._8_8_)) ||
              (sVar5 < fillVal.type.id + field._8_8_)) ||
             (fillVal.type.id + field._8_8_ < fillVal.type.id)) {
            (*this->_vptr_ExpressionRunner[2])(this,"out of bounds array access in array.fill");
          }
          for (local_1f0 = 0; local_1f0 < (ulong)field._8_8_; local_1f0 = local_1f0 + 1) {
            peVar4 = std::
                     __shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&indexVal);
            pLVar3 = SmallVector<wasm::Literal,_1UL>::operator[]
                               (&(peVar4->values).super_SmallVector<wasm::Literal,_1UL>,
                                fillVal.type.id + local_1f0);
            wasm::Literal::operator=(pLVar3,(Literal *)&sizeVal);
          }
          Flow::Flow(__return_storage_ptr__);
          wasm::Literal::~Literal((Literal *)&sizeVal);
          std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&indexVal);
        }
        Flow::~Flow((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
      }
      Flow::~Flow((Flow *)&size.breakTo.super_IString.str._M_str);
    }
    Flow::~Flow((Flow *)&value.breakTo.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayFill(ArrayFill* curr) {
    NOTE_ENTER("ArrayFill");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    size_t indexVal = index.getSingleValue().getUnsigned();
    Literal fillVal = value.getSingleValue();
    size_t sizeVal = size.getSingleValue().getUnsigned();

    auto field = curr->ref->type.getHeapType().getArray().element;
    fillVal = truncateForPacking(fillVal, field);

    size_t arraySize = data->values.size();
    if (indexVal > arraySize || sizeVal > arraySize ||
        indexVal + sizeVal > arraySize || indexVal + sizeVal < indexVal) {
      trap("out of bounds array access in array.fill");
    }
    for (size_t i = 0; i < sizeVal; ++i) {
      data->values[indexVal + i] = fillVal;
    }
    return {};
  }